

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(Curl_easy *data,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  char **ppcVar2;
  curl_off_t *pcVar3;
  connectdata *pcVar4;
  long lVar5;
  ulong uVar6;
  dynbuf *s;
  curl_off_t *pcVar7;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode CVar10;
  CHUNKcode CVar11;
  CURLcode CVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  timediff_t tVar18;
  size_t size;
  char *pcVar19;
  connectdata *pcVar20;
  char *pcVar21;
  curl_socket_t sockfd;
  http_connect_state *phVar22;
  bool bVar23;
  char byte;
  size_t fillcount;
  int subversion;
  ssize_t tookcareof;
  CURLcode extra;
  char local_bd;
  curl_socket_t local_bc;
  connectdata *local_b8;
  int *local_b0;
  dynbuf *local_a8;
  size_t local_a0;
  int local_94;
  dynbuf *local_90;
  int local_88;
  uint local_84;
  curl_off_t *local_80;
  HTTP *local_78;
  int local_70;
  undefined4 local_6c;
  http_connect_state *local_68;
  CURLcode local_60 [2];
  long local_58;
  curl_off_t *local_50;
  connectdata *local_48;
  char *local_40;
  CURLcode local_34;
  
  pcVar4 = data->conn;
  local_94 = sockindex;
  local_84 = remote_port;
  if ((pcVar4->connect_state != (http_connect_state *)0x0) ||
     (CVar10 = connect_init(data,false), CVar10 == CURLE_OK)) {
    local_6c = 0;
    pcVar20 = data->conn;
    phVar22 = pcVar20->connect_state;
    CVar10 = CURLE_OK;
    local_48 = pcVar4;
    local_40 = hostname;
    if ((phVar22 != (http_connect_state *)0x0) && (phVar22->tunnel_state < TUNNEL_COMPLETE)) {
      local_78 = (data->req).p.http;
      local_58 = (long)local_94;
      local_bc = pcVar20->sock[local_58];
      puVar1 = &(pcVar20->bits).field_0x4;
      *puVar1 = *puVar1 & 0xef;
      local_a8 = &phVar22->req;
      local_50 = &(data->info).request_size;
      local_90 = &phVar22->rcvbuf;
      local_b0 = &(data->req).httpcode;
      local_80 = &phVar22->cl;
      local_b8 = pcVar20;
      local_68 = phVar22;
      CVar10 = CURLE_OK;
      do {
        pcVar16 = local_40;
        CVar9 = CVar10;
        if (phVar22->tunnel_state == TUNNEL_INIT) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d",local_40,(ulong)local_84);
          (*Curl_cfree)((data->req).newurl);
          (data->req).newurl = (char *)0x0;
          Curl_dyn_init(local_a8,0x100000);
          if ((pcVar20->host).name == pcVar16) {
            bVar23 = (bool)(((pcVar20->bits).field_0x5 & 8) >> 3);
          }
          else {
            pcVar15 = strchr(pcVar16,0x3a);
            bVar23 = pcVar15 != (char *)0x0;
          }
          pcVar19 = "";
          pcVar15 = "";
          if (bVar23 != false) {
            pcVar15 = "[";
            pcVar19 = "]";
          }
          pcVar17 = (char *)0x0;
          pcVar16 = curl_maprintf("%s%s%s:%d",pcVar15,pcVar16,pcVar19,(ulong)local_84);
          CVar9 = CURLE_OUT_OF_MEMORY;
          if (pcVar16 == (char *)0x0) {
LAB_006134b6:
            pcVar17 = (char *)0x0;
            pcVar16 = (char *)0x0;
            bVar23 = false;
          }
          else {
            pcVar15 = Curl_checkProxyheaders(data,local_b8,"Host",4);
            bVar23 = true;
            if ((pcVar15 == (char *)0x0) &&
               (pcVar17 = curl_maprintf("Host: %s\r\n"), pcVar17 == (char *)0x0)) {
              (*Curl_cfree)(pcVar16);
              goto LAB_006134b6;
            }
            CVar9 = CURLE_OK;
          }
          if (bVar23) {
            CVar9 = Curl_http_output_auth(data,local_b8,"CONNECT",HTTPREQ_GET,pcVar16,true);
            phVar22 = local_68;
            if (CVar9 == CURLE_OK) {
              pcVar15 = "1.1";
              if ((local_b8->http_proxy).proxytype == '\x01') {
                pcVar15 = "1.0";
              }
              pcVar19 = pcVar17;
              if (pcVar17 == (char *)0x0) {
                pcVar19 = "";
              }
              pcVar21 = (data->state).aptr.proxyuserpwd;
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "";
              }
              CVar9 = Curl_dyn_addf(local_a8,"CONNECT %s HTTP/%s\r\n%s%s",pcVar16,pcVar15,pcVar19,
                                    pcVar21);
              if (CVar9 == CURLE_OK) {
                pcVar15 = Curl_checkProxyheaders(data,local_b8,"User-Agent",10);
                CVar9 = CURLE_OK;
                if ((pcVar15 == (char *)0x0) &&
                   (CVar9 = CURLE_OK, (data->set).str[0x24] != (char *)0x0)) {
                  CVar9 = Curl_dyn_addf(local_a8,"User-Agent: %s\r\n");
                }
              }
              if (CVar9 == CURLE_OK) {
                pcVar15 = Curl_checkProxyheaders(data,local_b8,"Proxy-Connection",0x10);
                CVar9 = CURLE_OK;
                if (pcVar15 == (char *)0x0) {
                  CVar9 = Curl_dyn_addn(local_a8,"Proxy-Connection: Keep-Alive\r\n",0x1e);
                }
              }
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_add_custom_headers(data,true,local_a8);
              }
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_dyn_addn(local_a8,"\r\n",2);
              }
              if (CVar9 == CURLE_OK) {
                CVar9 = Curl_buffer_send(local_a8,data,local_50,0,local_94);
                phVar22->headerlines = 0;
              }
              if (CVar9 != CURLE_OK) {
                Curl_failf(data,"Failed sending CONNECT to proxy");
              }
            }
            (*Curl_cfree)(pcVar17);
            (*Curl_cfree)(pcVar16);
            if (CVar9 == CURLE_OK) {
              phVar22->tunnel_state = TUNNEL_CONNECT;
              bVar23 = true;
              CVar9 = CVar10;
            }
            else {
              bVar23 = false;
            }
          }
          else {
            bVar23 = false;
            phVar22 = local_68;
          }
          iVar13 = 1;
          pcVar20 = local_b8;
          CVar10 = CVar9;
          if (bVar23) goto LAB_00613688;
        }
        else {
LAB_00613688:
          tVar18 = Curl_timeleft(data,(curltime *)0x0,true);
          if (tVar18 < 1) {
            Curl_failf(data,"Proxy CONNECT aborted due to timeout");
            CVar10 = CURLE_OPERATION_TIMEDOUT;
          }
          else {
            _Var8 = Curl_conn_data_pending(pcVar20,local_94);
            if ((_Var8) || (local_78->sending != HTTPSEND_NADA)) {
              if (local_78->sending == HTTPSEND_REQUEST) {
                if (phVar22->nsend == 0) {
                  (data->req).upload_fromhere = (data->state).ulbuf;
                  CVar12 = Curl_fillreadbuffer(data,(ulong)(data->set).upload_buffer_size,&local_a0)
                  ;
                  CVar10 = CVar12;
                  if (CVar12 == CURLE_OK) {
                    phVar22->nsend = local_a0;
                    CVar10 = CVar9;
                  }
                  CVar9 = CVar10;
                  iVar13 = 1;
                  CVar10 = CVar9;
                  if (CVar12 != CURLE_OK) goto LAB_00613e4a;
                }
                if (phVar22->nsend != 0) {
                  CVar10 = Curl_write(data,pcVar20->writesockfd,(data->req).upload_fromhere,
                                      phVar22->nsend,(ssize_t *)&local_a0);
                  if (CVar10 == CURLE_OK) {
                    Curl_debug(data,CURLINFO_HEADER_OUT,(data->req).upload_fromhere,local_a0);
                  }
                  phVar22->nsend = phVar22->nsend - local_a0;
                  ppcVar2 = &(data->req).upload_fromhere;
                  *ppcVar2 = *ppcVar2 + local_a0;
                  goto LAB_00613765;
                }
                local_78->sending = HTTPSEND_NADA;
              }
              bVar23 = false;
              if (phVar22->keepon != KEEPON_DONE) {
                local_88 = 0;
                sockfd = local_bc;
                do {
                  CVar10 = Curl_read(data,sockfd,&local_bd,1,(ssize_t *)&local_a0);
                  iVar13 = 1;
                  if (CVar10 == CURLE_AGAIN) {
                    CVar12 = CURLE_OK;
                  }
                  else {
                    iVar14 = Curl_pgrsUpdate(data);
                    if (iVar14 == 0) {
                      CVar12 = CVar9;
                      if (CVar10 == CURLE_OK) {
                        if ((long)local_a0 < 1) {
                          if ((((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0))
                             || ((data->state).aptr.proxyuserpwd == (char *)0x0)) {
                            Curl_failf(data,"Proxy CONNECT aborted");
                            local_88 = 1;
                          }
                          else {
                            puVar1 = &(local_b8->bits).field_0x4;
                            *puVar1 = *puVar1 | 0x10;
                            Curl_infof(data,"Proxy CONNECT connection closed");
                          }
                          goto LAB_0061382e;
                        }
                        if (phVar22->keepon != KEEPON_IGNORE) {
                          CVar10 = Curl_dyn_addn(local_90,&local_bd,1);
                          s = local_90;
                          if (CVar10 == CURLE_OK) {
                            if (local_bd == '\n') {
                              phVar22->headerlines = phVar22->headerlines + 1;
                              pcVar16 = Curl_dyn_ptr(local_90);
                              size = Curl_dyn_len(s);
                              Curl_debug(data,CURLINFO_HEADER_IN,pcVar16,size);
                              uVar6 = *(ulong *)&(data->set).field_0x8e2;
                              if (((uVar6 >> 0x2b & 1) != 0) ||
                                 (CVar12 = Curl_client_write(data,((uint)(uVar6 >> 0x16) & 1) + 10 +
                                                                  (uint)(phVar22->headerlines == 1)
                                                                  * 4,pcVar16,size),
                                 sockfd = local_bc, CVar12 == CURLE_OK)) {
                                pcVar7 = local_80;
                                sockfd = local_bc;
                                pcVar3 = &(data->info).header_size;
                                *pcVar3 = *pcVar3 + size;
                                if ((*pcVar16 == '\r') || (*pcVar16 == '\n')) {
                                  if ((*local_b0 == 0x197) &&
                                     (((data->state).field_0x6d0 & 0x20) == 0)) {
                                    phVar22->keepon = KEEPON_IGNORE;
                                    if (phVar22->cl == 0) {
                                      if ((phVar22->field_0x354 & 1) == 0) {
                                        phVar22->keepon = KEEPON_DONE;
                                      }
                                      else {
                                        Curl_infof(data,"Ignore chunked response-body");
                                        puVar1 = &(data->req).field_0xd9;
                                        *puVar1 = *puVar1 | 8;
                                        pcVar15 = pcVar16 + 1;
                                        if (pcVar16[1] != '\n') {
                                          pcVar15 = pcVar16;
                                        }
                                        CVar11 = Curl_httpchunk_read(data,pcVar15 + 1,1,
                                                                     (ssize_t *)&local_a0,local_60);
                                        if (CVar11 == CHUNKE_STOP) {
                                          Curl_infof(data,"chunk reading DONE");
                                          phVar22->keepon = KEEPON_DONE;
                                          phVar22->tunnel_state = TUNNEL_COMPLETE;
                                        }
                                      }
                                    }
                                    else {
                                      Curl_infof(data,"Ignore %ld bytes of response-body");
                                    }
                                  }
                                  else {
                                    phVar22->keepon = KEEPON_DONE;
                                  }
                                  if ((phVar22->keepon == KEEPON_DONE) && (*pcVar7 == 0))
                                  goto LAB_0061398e;
                                  goto LAB_00613aab;
                                }
                                iVar14 = curl_strnequal(pcVar16,"WWW-Authenticate:",0x11);
                                if (((iVar14 == 0) || (*local_b0 != 0x191)) &&
                                   ((iVar14 = curl_strnequal(pcVar16,"Proxy-authenticate:",0x13),
                                    iVar14 == 0 || (*local_b0 != 0x197)))) {
                                  iVar13 = curl_strnequal(pcVar16,"Content-Length:",0xf);
                                  sockfd = local_bc;
                                  if (iVar13 == 0) {
                                    _Var8 = Curl_compareheader(pcVar16,"Connection:",0xb,"close",5);
                                    sockfd = local_bc;
                                    if (_Var8) {
LAB_00613bf1:
                                      phVar22->field_0x354 = phVar22->field_0x354 | 2;
                                    }
                                    else {
                                      iVar13 = curl_strnequal(pcVar16,"Transfer-Encoding:",0x12);
                                      if (iVar13 == 0) {
                                        _Var8 = Curl_compareheader(pcVar16,"Proxy-Connection:",0x11,
                                                                   "close",5);
                                        if (_Var8) goto LAB_00613bf1;
                                        iVar13 = __isoc99_sscanf(pcVar16,"HTTP/1.%d %d",&local_6c,
                                                                 local_b0);
                                        if (iVar13 == 2) {
                                          (data->info).httpproxycode = (data->req).httpcode;
                                        }
                                      }
                                      else {
                                        if (*local_b0 - 200U < 100) {
                                          pcVar16 = 
                                          "Ignoring Transfer-Encoding in CONNECT %03d response";
                                          goto LAB_00613b86;
                                        }
                                        _Var8 = Curl_compareheader(pcVar16,"Transfer-Encoding:",0x12
                                                                   ,"chunked",7);
                                        if (_Var8) {
                                          Curl_infof(data,"CONNECT responded chunked");
                                          phVar22->field_0x354 = phVar22->field_0x354 | 1;
                                          Curl_httpchunk_init(data);
                                        }
                                      }
                                    }
                                  }
                                  else if (*local_b0 - 200U < 100) {
                                    pcVar16 = "Ignoring Content-Length in CONNECT %03d response";
LAB_00613b86:
                                    Curl_infof(data,pcVar16);
                                  }
                                  else {
                                    curlx_strtoofft(pcVar16 + 0xf,(char **)0x0,10,local_80);
                                  }
                                }
                                else {
                                  local_70 = *local_b0;
                                  pcVar16 = Curl_copy_header_value(pcVar16);
                                  if (pcVar16 == (char *)0x0) {
                                    bVar23 = false;
                                    CVar9 = CURLE_OUT_OF_MEMORY;
                                  }
                                  else {
                                    CVar10 = Curl_http_input_auth(data,local_70 == 0x197,pcVar16);
                                    (*Curl_cfree)(pcVar16);
                                    bVar23 = CVar10 == CURLE_OK;
                                    if (!bVar23) {
                                      CVar9 = CVar10;
                                    }
                                  }
                                  sockfd = local_bc;
                                  CVar12 = CVar9;
                                  if (!bVar23) goto LAB_0061383f;
                                }
                                Curl_dyn_reset(local_90);
                                iVar13 = 0;
                                CVar12 = CVar9;
                              }
                            }
                            else {
LAB_00613aab:
                              iVar13 = 6;
                              CVar12 = CVar9;
                            }
                          }
                          else {
                            Curl_failf(data,"CONNECT response too large");
                            CVar12 = CURLE_RECV_ERROR;
                          }
                          goto LAB_0061383f;
                        }
                        lVar5 = *local_80;
                        if (lVar5 == 0) {
                          local_60[0] = CURLE_OK;
                          local_60[1] = CURLE_OK;
                          CVar11 = Curl_httpchunk_read(data,&local_bd,1,(ssize_t *)local_60,
                                                       &local_34);
                          if (CVar11 == CHUNKE_STOP) {
                            Curl_infof(data,"chunk reading DONE");
                            phVar22->keepon = KEEPON_DONE;
LAB_0061398e:
                            phVar22->tunnel_state = TUNNEL_COMPLETE;
                          }
                          goto LAB_00613aab;
                        }
                        *local_80 = lVar5 + -1;
                        iVar13 = 6;
                        if (1 < lVar5) goto LAB_0061383f;
                        phVar22->keepon = KEEPON_DONE;
                        phVar22->tunnel_state = TUNNEL_COMPLETE;
                      }
                      else {
LAB_0061382e:
                        phVar22->keepon = KEEPON_DONE;
                      }
                      iVar13 = 7;
                    }
                    else {
                      CVar12 = CURLE_ABORTED_BY_CALLBACK;
                    }
                  }
LAB_0061383f:
                  CVar9 = CVar12;
                  pcVar20 = local_b8;
                  if ((iVar13 != 0) && (iVar13 != 6)) {
                    CVar10 = CVar9;
                    if (iVar13 != 7) goto LAB_00613e45;
                    break;
                  }
                } while (phVar22->keepon != KEEPON_DONE);
                bVar23 = local_88 != 0;
              }
              iVar14 = Curl_pgrsUpdate(data);
              CVar10 = CURLE_RECV_ERROR;
              if (iVar14 != 0) {
                CVar10 = CURLE_ABORTED_BY_CALLBACK;
              }
              iVar13 = 1;
              if (!(bool)(iVar14 != 0 | bVar23)) {
                if (99 < (data->info).httpproxycode - 200U) {
                  CVar10 = Curl_http_auth_act(data);
                  if (CVar10 != CURLE_OK) goto LAB_00613e45;
                  if (((pcVar20->bits).field_0x4 & 0x40) != 0) {
                    phVar22->field_0x354 = phVar22->field_0x354 | 2;
                  }
                }
                lVar5 = local_58;
                iVar13 = 0;
                CVar10 = CVar9;
                if (((phVar22->field_0x354 & 2) != 0) && ((data->req).newurl != (char *)0x0)) {
                  Curl_closesocket(data,pcVar20,pcVar20->sock[local_58]);
                  pcVar20->sock[lVar5] = -1;
                  iVar13 = 2;
                }
              }
LAB_00613e45:
              if (((iVar13 == 0) && (iVar13 = 0, (data->req).newurl != (char *)0x0)) &&
                 (phVar22->tunnel_state == TUNNEL_COMPLETE)) {
                connect_init(data,true);
              }
              goto LAB_00613e4a;
            }
            CVar10 = CURLE_OK;
          }
LAB_00613765:
          iVar13 = 1;
        }
LAB_00613e4a:
        if (iVar13 != 0) {
          if (iVar13 != 2) goto LAB_00613fd9;
          break;
        }
      } while ((data->req).newurl != (char *)0x0);
      if ((data->info).httpproxycode - 200U < 100) {
        phVar22->tunnel_state = TUNNEL_COMPLETE;
        (*Curl_cfree)((data->state).aptr.proxyuserpwd);
        (data->state).aptr.proxyuserpwd = (char *)0x0;
        (data->state).authproxy.field_0x18 = ((data->state).authproxy.field_0x18 & 0xfc) + 1;
        CVar10 = CURLE_OK;
        Curl_infof(data,"Proxy replied %d to CONNECT request",
                   (ulong)(uint)(data->info).httpproxycode);
        puVar1 = &(data->req).field_0xd9;
        *puVar1 = *puVar1 & 0xf7;
        puVar1 = &(pcVar20->bits).field_0x6;
        *puVar1 = *puVar1 & 0xfd;
        Curl_dyn_free(local_90);
      }
      else {
        if (((phVar22->field_0x354 & 2) == 0) || ((data->req).newurl == (char *)0x0)) {
          (*Curl_cfree)((data->req).newurl);
          (data->req).newurl = (char *)0x0;
          Curl_conncontrol(pcVar20,2);
        }
        else {
          puVar1 = &(pcVar20->bits).field_0x4;
          *puVar1 = *puVar1 | 0x10;
          Curl_infof(data,"Connect me again please");
          Curl_connect_done(data);
        }
        phVar22->tunnel_state = TUNNEL_INIT;
        CVar10 = CURLE_OK;
        if (((pcVar20->bits).field_0x4 & 0x10) == 0) {
          Curl_dyn_free(local_90);
          Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                     (ulong)(uint)(data->req).httpcode);
          CVar10 = CURLE_RECV_ERROR;
        }
      }
    }
LAB_00613fd9:
    if (((CVar10 != CURLE_OK) || (local_48->connect_state == (http_connect_state *)0x0)) ||
       (TUNNEL_CONNECT < local_48->connect_state->tunnel_state)) {
      Curl_connect_done(data);
    }
  }
  return CVar10;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct Curl_easy *data,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  if(!conn->connect_state) {
    result = connect_init(data, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(data, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    Curl_connect_done(data);

  return result;
}